

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRef.c
# Opt level: O1

void cuddReclaimZdd(DdManager *table,DdNode *n)

{
  uint *puVar1;
  DdHalfWord DVar2;
  int iVar3;
  DdNode **ppDVar4;
  DdNode *pDVar5;
  anon_union_16_2_50f58667_for_type *paVar6;
  int iVar7;
  
  ppDVar4 = table->stack;
  iVar7 = 1;
  pDVar5 = n;
  do {
    DVar2 = pDVar5->ref;
    pDVar5->ref = DVar2 + 1;
    if (DVar2 == 0) {
      table->deadZ = table->deadZ - 1;
      table->reclaimed = table->reclaimed + 1.0;
      iVar3 = table->permZ[pDVar5->index];
      paVar6 = &pDVar5->type;
      ppDVar4[iVar7] = (pDVar5->type).kids.E;
      puVar1 = &table->subtableZ[iVar3].dead;
      *puVar1 = *puVar1 - 1;
      iVar7 = iVar7 + 1;
    }
    else {
      paVar6 = (anon_union_16_2_50f58667_for_type *)(ppDVar4 + (long)iVar7 + -1);
      iVar7 = iVar7 + -1;
    }
    pDVar5 = (paVar6->kids).T;
  } while (iVar7 != 0);
  n->ref = n->ref - 1;
  return;
}

Assistant:

void
cuddReclaimZdd(
  DdManager * table,
  DdNode * n)
{
    DdNode *N;
    int ord;
    DdNodePtr *stack = table->stack;
    int SP = 1;

    N = n;

#ifdef DD_DEBUG
    assert(N->ref == 0);
#endif

    do {
        cuddSatInc(N->ref);

        if (N->ref == 1) {
            table->deadZ--;
            table->reclaimed++;
#ifdef DD_DEBUG
            assert(!cuddIsConstant(N));
#endif
            ord = table->permZ[N->index];
            stack[SP++] = cuddE(N);
            table->subtableZ[ord].dead--;
            N = cuddT(N);
        } else {
            N = stack[--SP];
        }
    } while (SP != 0);

    cuddSatDec(n->ref);

}